

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_serialize(ext_key *hdkey,uint32_t flags,uchar *bytes_out,size_t len)

{
  _Bool _Var1;
  uchar *puVar2;
  beint32_t local_48;
  uint32_t local_44;
  beint32_t tmp32_be;
  uint32_t tmp32;
  uchar *out;
  size_t sStack_30;
  _Bool serialize_private;
  size_t len_local;
  uchar *bytes_out_local;
  ext_key *peStack_18;
  uint32_t flags_local;
  ext_key *hdkey_local;
  
  out._7_1_ = ((flags & 1) != 0 ^ 0xffU) & 1;
  if ((flags & 0xfffffffe) == 0) {
    if (((hdkey == (ext_key *)0x0) ||
        (((_tmp32_be = bytes_out, sStack_30 = len, len_local = (size_t)bytes_out,
          bytes_out_local._4_4_ = flags, peStack_18 = hdkey, out._7_1_ != 0 &&
          (_Var1 = key_is_private(hdkey), !_Var1)) || (_Var1 = key_is_valid(peStack_18), !_Var1))))
       || ((len_local == 0 || (sStack_30 != 0x4e)))) {
      hdkey_local._4_4_ = -2;
    }
    else {
      local_44 = peStack_18->version;
      if ((out._7_1_ & 1) == 0) {
        if (local_44 == 0x488ade4) {
          local_44 = 0x488b21e;
        }
        else if (local_44 == 0x4358394) {
          local_44 = 0x43587cf;
        }
      }
      local_48 = cpu_to_be32(local_44);
      puVar2 = copy_out(_tmp32_be,&local_48,4);
      _tmp32_be = puVar2 + 1;
      *puVar2 = peStack_18->depth;
      _tmp32_be = copy_out(_tmp32_be,peStack_18->parent160,4);
      local_48 = cpu_to_be32(peStack_18->child_num);
      _tmp32_be = copy_out(_tmp32_be,&local_48,4);
      _tmp32_be = copy_out(_tmp32_be,peStack_18,0x20);
      if ((out._7_1_ & 1) == 0) {
        copy_out(_tmp32_be,peStack_18->pub_key,0x21);
      }
      else {
        copy_out(_tmp32_be,peStack_18->priv_key,0x21);
      }
      hdkey_local._4_4_ = 0;
    }
  }
  else {
    hdkey_local._4_4_ = -2;
  }
  return hdkey_local._4_4_;
}

Assistant:

int bip32_key_serialize(const struct ext_key *hdkey, uint32_t flags,
                        unsigned char *bytes_out, size_t len)
{
    const bool serialize_private = !(flags & BIP32_FLAG_KEY_PUBLIC);
    unsigned char *out = bytes_out;
    uint32_t tmp32;
    beint32_t tmp32_be;

    if (flags & ~BIP32_FLAG_KEY_PUBLIC)
        return WALLY_EINVAL; /* Only this flag makes sense here */

    /* Validate our arguments and then the input key */
    if (!hdkey ||
        (serialize_private && !key_is_private(hdkey)) ||
        !key_is_valid(hdkey) ||
        !bytes_out || len != BIP32_SERIALIZED_LEN)
        return WALLY_EINVAL;

    tmp32 = hdkey->version;
    if (!serialize_private) {
        /* Change version if serializing the public part of a private key */
        if (tmp32 == BIP32_VER_MAIN_PRIVATE)
            tmp32 = BIP32_VER_MAIN_PUBLIC;
        else if (tmp32 == BIP32_VER_TEST_PRIVATE)
            tmp32 = BIP32_VER_TEST_PUBLIC;
    }
    tmp32_be = cpu_to_be32(tmp32);
    out = copy_out(out, &tmp32_be, sizeof(tmp32_be));

    *out++ = hdkey->depth;

    /* Save the first 32 bits of the parent key (aka fingerprint) only */
    out = copy_out(out, hdkey->parent160, BIP32_KEY_FINGERPRINT_LEN);

    tmp32_be = cpu_to_be32(hdkey->child_num);
    out = copy_out(out, &tmp32_be, sizeof(tmp32_be));

    out = copy_out(out, hdkey->chain_code, sizeof(hdkey->chain_code));

    if (serialize_private)
        copy_out(out, hdkey->priv_key, sizeof(hdkey->priv_key));
    else
        copy_out(out, hdkey->pub_key, sizeof(hdkey->pub_key));

    return WALLY_OK;
}